

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O0

void __thiscall glslang::TProcesses::addProcess(TProcesses *this,char *process)

{
  allocator<char> local_39;
  value_type local_38;
  char *local_18;
  char *process_local;
  TProcesses *this_local;
  
  local_18 = process;
  process_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,process,&local_39);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->processes,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void addProcess(const char* process)
    {
        processes.push_back(process);
    }